

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<tinyusdz::value::half,float>
               (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *src,
               vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,float eps)

{
  half a;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint *puVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  const_reference pvVar9;
  half *__s;
  reference ppVar10;
  reference pvVar11;
  pair<const_unsigned_int,_tinyusdz::value::half> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
  *__range3;
  value_type local_7c;
  ulong uStack_78;
  uint32_t vidx;
  size_t i;
  undefined1 local_68 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
  vdata;
  float eps_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *dst_local;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *src_local;
  
  if (dst == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket._4_4_ = eps;
    sVar3 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::size(src);
    sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
    if (sVar3 == sVar4) {
      sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
      if (sVar3 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
        ::unordered_map((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                         *)local_68);
        i._4_4_ = 0;
        for (uStack_78 = 0; uVar1 = uStack_78,
            sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (faceVertexIndices), uVar1 < sVar3; uStack_78 = uStack_78 + 1) {
          pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (faceVertexIndices,uStack_78);
          local_7c = *pvVar5;
          puVar6 = ::std::max<unsigned_int>(&local_7c,(uint *)((long)&i + 4));
          i._4_4_ = *puVar6;
          sVar7 = ::std::
                  unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                  ::count((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                           *)local_68,&local_7c);
          if (sVar7 == 0) {
            pvVar9 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                     operator[](src,uStack_78);
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                     ::operator[]((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                                   *)local_68,&local_7c);
            pmVar8->value = pvVar9->value;
          }
          else {
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                     ::operator[]((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                                   *)local_68,&local_7c);
            a.value = pmVar8->value;
            pvVar9 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                     operator[](src,uStack_78);
            bVar2 = math::is_close(a,(half)pvVar9->value,vdata._M_h._M_single_bucket._4_4_);
            if (!bVar2) {
              src_local._7_1_ = false;
              goto LAB_004ff6c8;
            }
          }
        }
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                  (dst,(ulong)(i._4_4_ + 1));
        __s = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::data
                        (dst);
        memset(__s,0,(ulong)(i._4_4_ + 1) << 1);
        __end0 = ::std::
                 unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                 ::begin((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                          *)local_68);
        v = (pair<const_unsigned_int,_tinyusdz::value::half> *)
            ::std::
            unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
            ::end((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                   *)local_68);
        while (bVar2 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::value::half>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::value::half>,_false>
                                    *)&v), bVar2) {
          ppVar10 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::value::half>,_false,_false>
                    ::operator*(&__end0);
          pvVar11 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                    operator[](dst,(ulong)ppVar10->first);
          pvVar11->value = (ppVar10->second).value;
          ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::value::half>,_false,_false>::
          operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_004ff6c8:
        ::std::
        unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
                          *)local_68);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}